

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O2

UA_StatusCode UA_Client_disconnect(UA_Client *client)

{
  UA_Connection *pUVar1;
  anon_struct_16_2_3fe6ac49_for_decoded *offset;
  UA_Boolean UVar2;
  UA_StatusCode UVar3;
  UA_StatusCode UVar4;
  UA_StatusCode UVar5;
  uint uVar6;
  uint uVar7;
  undefined1 auStack_178 [8];
  UA_CloseSessionRequest request;
  undefined1 auStack_f8 [8];
  UA_CloseSessionResponse response;
  undefined1 local_64 [8];
  UA_SecureConversationMessageHeader msgHeader;
  UA_SequenceHeader seqHeader;
  UA_ByteString message;
  UA_SymmetricAlgorithmSecurityHeader local_38;
  uint local_34;
  UA_SymmetricAlgorithmSecurityHeader symHeader;
  
  if (client->state == UA_CLIENTSTATE_READY) {
    UVar3 = 0x808a0000;
  }
  else {
    UVar3 = 0;
    if ((client->connection).state == UA_CONNECTION_ESTABLISHED) {
      UVar2 = UA_NodeId_equal(&client->authenticationToken,&UA_NODEID_NULL);
      uVar7 = 0;
      if (!UVar2) {
        request.requestHeader.additionalHeader.content._16_8_ = 0;
        request.requestHeader.additionalHeader.content.encoded.body.length = 0;
        request.requestHeader.additionalHeader.content.decoded.type = (UA_DataType *)0x0;
        request.requestHeader.additionalHeader.content.decoded.data = (void *)0x0;
        request.requestHeader.timeoutHint = 0;
        request.requestHeader._60_4_ = 0;
        request.requestHeader.additionalHeader.encoding = UA_EXTENSIONOBJECT_ENCODED_NOBODY;
        request.requestHeader.additionalHeader._4_4_ = 0;
        request.requestHeader.auditEntryId.length = 0;
        request.requestHeader.auditEntryId.data = (UA_Byte *)0x0;
        request.requestHeader.timestamp = 0;
        request.requestHeader.requestHandle = 0;
        request.requestHeader.returnDiagnostics = 0;
        request.requestHeader.authenticationToken.identifier.string.length = 0;
        request.requestHeader.authenticationToken.identifier.string.data = (UA_Byte *)0x0;
        auStack_178._0_2_ = 0;
        auStack_178._2_2_ = 0;
        auStack_178._4_4_ = UA_NODEIDTYPE_NUMERIC;
        request.requestHeader.authenticationToken.namespaceIndex = 0;
        request.requestHeader.authenticationToken._2_2_ = 0;
        request.requestHeader.authenticationToken.identifierType = UA_NODEIDTYPE_NUMERIC;
        request.requestHeader.additionalHeader.content.encoded.body.data = (UA_Byte *)0x0;
        request.requestHeader.authenticationToken.identifier.string.data =
             (UA_Byte *)UA_DateTime_now();
        request.requestHeader.auditEntryId.data =
             (UA_Byte *)CONCAT44(request.requestHeader.auditEntryId.data._4_4_,10000);
        request.requestHeader.additionalHeader.content._32_1_ = 1;
        __UA_Client_Service(client,auStack_178,UA_TYPES + 99,auStack_f8,UA_TYPES + 0x8e);
        UA_deleteMembers(auStack_178,UA_TYPES + 99);
        UA_deleteMembers(auStack_f8,UA_TYPES + 0x8e);
        uVar7 = response.responseHeader.timestamp._4_4_;
        if ((client->connection).state != UA_CONNECTION_ESTABLISHED) {
          return response.responseHeader.timestamp._4_4_;
        }
      }
      pUVar1 = &client->connection;
      response.responseHeader.additionalHeader.encoding = UA_EXTENSIONOBJECT_ENCODED_NOBODY;
      response.responseHeader.additionalHeader._4_4_ = 0;
      response.responseHeader.additionalHeader.content.decoded.type = (UA_DataType *)0x0;
      response.responseHeader.stringTableSize = 0;
      response.responseHeader.stringTable = (UA_String *)0x0;
      response.responseHeader.serviceDiagnostics.innerStatusCode = 0;
      response.responseHeader.serviceDiagnostics._44_4_ = 0;
      response.responseHeader.serviceDiagnostics.innerDiagnosticInfo = (UA_DiagnosticInfo *)0x0;
      response.responseHeader.serviceDiagnostics.additionalInfo.length = 0;
      response.responseHeader.serviceDiagnostics.additionalInfo.data = (UA_Byte *)0x0;
      response.responseHeader.serviceDiagnostics.locale = 0;
      response.responseHeader.serviceDiagnostics._20_4_ = 0;
      response.responseHeader.requestHandle = 0;
      response.responseHeader.serviceResult = 0;
      response.responseHeader.serviceDiagnostics._0_4_ = 0;
      response.responseHeader.serviceDiagnostics.symbolicId = 0;
      auStack_f8._0_2_ = 0;
      auStack_f8._2_2_ = 0;
      auStack_f8._4_4_ = UA_NODEIDTYPE_NUMERIC;
      response.responseHeader.timestamp = 0;
      response.responseHeader.serviceDiagnostics.namespaceUri = client->requestHandle + 1;
      client->requestHandle = response.responseHeader.serviceDiagnostics.namespaceUri;
      response.responseHeader.serviceDiagnostics.localizedText = 0;
      response.responseHeader.serviceDiagnostics._0_8_ = UA_DateTime_now();
      response.responseHeader.serviceDiagnostics.additionalInfo.data =
           (UA_Byte *)
           CONCAT44(response.responseHeader.serviceDiagnostics.additionalInfo.data._4_4_,10000);
      UA_NodeId_copy(&client->authenticationToken,(UA_NodeId *)auStack_f8);
      local_64._0_4_ = 0x464f4c43;
      msgHeader.messageHeader.messageTypeAndChunkType = (client->channel).securityToken.channelId;
      local_38.tokenId = (client->channel).securityToken.tokenId;
      msgHeader.messageHeader.messageSize = (client->channel).sendSequenceNumber + 1;
      (client->channel).sendSequenceNumber = msgHeader.messageHeader.messageSize;
      msgHeader.secureChannelId = client->requestId + 1;
      client->requestId = msgHeader.secureChannelId;
      auStack_178._0_2_ = 0;
      auStack_178._4_4_ = UA_NODEIDTYPE_NUMERIC;
      request.requestHeader.authenticationToken.namespaceIndex = 0x1c4;
      request.requestHeader.authenticationToken._2_2_ = 0;
      UVar3 = (*(client->connection).getSendBuffer)
                        (pUVar1,(ulong)(client->connection).remoteConf.recvBufferSize,
                         (UA_ByteString *)&seqHeader);
      if (UVar3 == 0) {
        offset = &response.responseHeader.additionalHeader.content.decoded + 2;
        response.responseHeader.additionalHeader.content.encoded.body.data = (UA_Byte *)0xc;
        UVar4 = UA_SymmetricAlgorithmSecurityHeader_encodeBinary
                          (&local_38,(UA_ByteString *)&seqHeader,(size_t *)offset);
        UVar5 = UA_SequenceHeader_encodeBinary
                          ((UA_SequenceHeader *)&msgHeader.messageHeader.messageSize,
                           (UA_ByteString *)&seqHeader,(size_t *)offset);
        local_34 = UA_NodeId_encodeBinary
                             ((UA_NodeId *)auStack_178,(UA_ByteString *)&seqHeader,(size_t *)offset)
        ;
        UVar3 = UA_encodeBinary(auStack_f8,UA_TYPES + 0x1f,(UA_exchangeEncodeBuffer)0x0,(void *)0x0,
                                (UA_ByteString *)&seqHeader,(size_t *)offset);
        uVar6 = UVar3 | local_34;
        local_64._4_4_ = response.responseHeader.additionalHeader.content._32_4_;
        response.responseHeader.additionalHeader.content.encoded.body.data = (UA_Byte *)0x0;
        UVar3 = UA_SecureConversationMessageHeader_encodeBinary
                          ((UA_SecureConversationMessageHeader *)local_64,
                           (UA_ByteString *)&seqHeader,(size_t *)offset);
        UVar3 = UVar3 | uVar6 | UVar5 | UVar4;
        if (UVar3 == 0) {
          seqHeader.requestId = 0;
          seqHeader.sequenceNumber = local_64._4_4_;
          UVar3 = (*(client->connection).send)(pUVar1,(UA_ByteString *)&seqHeader);
        }
        else {
          (*(client->connection).releaseSendBuffer)(pUVar1,(UA_ByteString *)&seqHeader);
        }
        (*(client->connection).close)(pUVar1);
      }
      UA_CloseSecureChannelRequest_deleteMembers((UA_CloseSecureChannelRequest *)auStack_f8);
      UVar3 = uVar7 | UVar3;
    }
  }
  return UVar3;
}

Assistant:

UA_StatusCode UA_Client_disconnect(UA_Client *client) {
    if(client->state == UA_CLIENTSTATE_READY)
        return UA_STATUSCODE_BADNOTCONNECTED;
    UA_StatusCode retval = UA_STATUSCODE_GOOD;
    /* Is a session established? */
    if(client->connection.state == UA_CONNECTION_ESTABLISHED &&
       !UA_NodeId_equal(&client->authenticationToken, &UA_NODEID_NULL))
        retval = CloseSession(client);
    /* Is a secure channel established? */
    if(client->connection.state == UA_CONNECTION_ESTABLISHED)
        retval |= CloseSecureChannel(client);
    return retval;
}